

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

LoopEvent rec_for_iter(IROp *op,cTValue *o,int isforl)

{
  double dVar1;
  double dVar2;
  int iVar3;
  lua_Number stepv;
  lua_Number idxv;
  lua_Number stopv;
  int isforl_local;
  cTValue *o_local;
  IROp *op_local;
  
  dVar1 = o[1].n;
  stepv = o->n;
  dVar2 = o[2].n;
  if (isforl != 0) {
    stepv = dVar2 + stepv;
  }
  iVar3 = rec_for_direction(o + 2);
  if (iVar3 == 0) {
    if (stepv < dVar1) {
      *op = IR_LT;
      op_local._4_4_ = LOOPEV_LEAVE;
    }
    else {
      *op = IR_GE;
      op_local._4_4_ = LOOPEV_ENTER;
      if (dVar2 + dVar2 + stepv < dVar1) {
        op_local._4_4_ = LOOPEV_ENTERLO;
      }
    }
  }
  else if (dVar1 < stepv) {
    *op = IR_GT;
    op_local._4_4_ = LOOPEV_LEAVE;
  }
  else {
    *op = IR_LE;
    op_local._4_4_ = LOOPEV_ENTER;
    if (dVar1 < dVar2 + dVar2 + stepv) {
      op_local._4_4_ = LOOPEV_ENTERLO;
    }
  }
  return op_local._4_4_;
}

Assistant:

static LoopEvent rec_for_iter(IROp *op, cTValue *o, int isforl)
{
  lua_Number stopv = numberVnum(&o[FORL_STOP]);
  lua_Number idxv = numberVnum(&o[FORL_IDX]);
  lua_Number stepv = numberVnum(&o[FORL_STEP]);
  if (isforl)
    idxv += stepv;
  if (rec_for_direction(&o[FORL_STEP])) {
    if (idxv <= stopv) {
      *op = IR_LE;
      return idxv + 2*stepv > stopv ? LOOPEV_ENTERLO : LOOPEV_ENTER;
    }
    *op = IR_GT; return LOOPEV_LEAVE;
  } else {
    if (stopv <= idxv) {
      *op = IR_GE;
      return idxv + 2*stepv < stopv ? LOOPEV_ENTERLO : LOOPEV_ENTER;
    }
    *op = IR_LT; return LOOPEV_LEAVE;
  }
}